

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O0

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *this_local;
  
  std::__cxx11::string::~string((string *)&this->overview_);
  std::__cxx11::string::~string((string *)&this->program_name_);
  option::~option(&this->super_option);
  return;
}

Assistant:

~help () override = default;